

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O0

uint32_t Diligent::GetDecorationOffset(Compiler *Compiler,Resource *Res,Decoration Decoration)

{
  bool bVar1;
  Char *pCVar2;
  char (*in_R8) [30];
  undefined1 local_78 [8];
  string msg_1;
  uint32_t local_50;
  bool declared;
  uint32_t offset;
  undefined1 local_40 [8];
  string msg;
  Decoration Decoration_local;
  Resource *Res_local;
  Compiler *Compiler_local;
  
  msg.field_2._8_4_ = (Res->id).id;
  msg.field_2._12_4_ = Decoration;
  bVar1 = diligent_spirv_cross::Compiler::has_decoration(Compiler,(ID)msg.field_2._8_4_,Decoration);
  if (!bVar1) {
    FormatString<char[11],std::__cxx11::string,char[30]>
              ((string *)local_40,(Diligent *)"Resource \'",(char (*) [11])&Res->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\' has no requested decoration",in_R8);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetDecorationOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x65);
    std::__cxx11::string::~string((string *)local_40);
  }
  local_50 = 0;
  msg_1.field_2._8_4_ = diligent_spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)Res);
  msg_1.field_2._M_local_buf[0xf] =
       diligent_spirv_cross::Compiler::get_binary_offset_for_decoration
                 (Compiler,(VariableID)msg_1.field_2._8_4_,msg.field_2._12_4_,&local_50);
  if (!(bool)msg_1.field_2._M_local_buf[0xf]) {
    FormatString<char[37]>((string *)local_78,(char (*) [37])"Requested decoration is not declared")
    ;
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetDecorationOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0x68);
    std::__cxx11::string::~string((string *)local_78);
  }
  return local_50;
}

Assistant:

static uint32_t GetDecorationOffset(const diligent_spirv_cross::Compiler& Compiler,
                                    const diligent_spirv_cross::Resource& Res,
                                    spv::Decoration                       Decoration)
{
    VERIFY(Compiler.has_decoration(Res.id, Decoration), "Resource \'", Res.name, "\' has no requested decoration");
    uint32_t offset   = 0;
    auto     declared = Compiler.get_binary_offset_for_decoration(Res.id, Decoration, offset);
    VERIFY(declared, "Requested decoration is not declared");
    (void)declared;
    return offset;
}